

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

KeyInfo * multiSelectOrderByKeyInfo(Parse *pParse,Select *p,int nExtra)

{
  long lVar1;
  KeyInfo *pKVar2;
  Expr *pEVar3;
  long in_RSI;
  long *in_RDI;
  CollSeq *pColl;
  Expr *pTerm;
  ExprList_item *pItem;
  int i;
  KeyInfo *pRet;
  sqlite3 *db;
  int nOrderBy;
  ExprList *pOrderBy;
  CollSeq *local_58;
  ExprList *zC;
  undefined8 in_stack_ffffffffffffffb8;
  Select *p_00;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar4;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar5;
  Parse *pParse_00;
  
  pParse_00 = *(Parse **)(in_RSI + 0x48);
  iVar5 = **(int **)(in_RSI + 0x48);
  lVar1 = *in_RDI;
  pKVar2 = sqlite3KeyInfoAlloc((sqlite3 *)
                               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                               (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                               (int)in_stack_ffffffffffffffb8);
  if (pKVar2 != (KeyInfo *)0x0) {
    for (iVar4 = 0; iVar4 < iVar5; iVar4 = iVar4 + 1) {
      p_00 = (Select *)(&pParse_00->zErrMsg + (long)iVar4 * 4);
      zC = p_00->pEList;
      if ((*(uint *)&zC->field_0x4 & 0x100) == 0) {
        local_58 = multiSelectCollSeq((Parse *)CONCAT44(iVar4,in_stack_ffffffffffffffc0),p_00,
                                      (int)((ulong)zC >> 0x20));
        if (local_58 == (CollSeq *)0x0) {
          local_58 = *(CollSeq **)(lVar1 + 0x10);
        }
        pEVar3 = sqlite3ExprAddCollateString
                           ((Parse *)CONCAT44(iVar4,in_stack_ffffffffffffffc0),(Expr *)p_00,
                            (char *)zC);
        (&pParse_00->zErrMsg)[(long)iVar4 * 4] = (char *)pEVar3;
      }
      else {
        local_58 = sqlite3ExprCollSeq(pParse_00,(Expr *)CONCAT44(iVar5,in_stack_ffffffffffffffd8));
      }
      pKVar2->aColl[iVar4] = local_58;
      pKVar2->aSortOrder[iVar4] = (&pParse_00->isMultiWrite)[(long)iVar4 * 0x20];
    }
  }
  return pKVar2;
}

Assistant:

static KeyInfo *multiSelectOrderByKeyInfo(Parse *pParse, Select *p, int nExtra){
  ExprList *pOrderBy = p->pOrderBy;
  int nOrderBy = p->pOrderBy->nExpr;
  sqlite3 *db = pParse->db;
  KeyInfo *pRet = sqlite3KeyInfoAlloc(db, nOrderBy+nExtra, 1);
  if( pRet ){
    int i;
    for(i=0; i<nOrderBy; i++){
      struct ExprList_item *pItem = &pOrderBy->a[i];
      Expr *pTerm = pItem->pExpr;
      CollSeq *pColl;

      if( pTerm->flags & EP_Collate ){
        pColl = sqlite3ExprCollSeq(pParse, pTerm);
      }else{
        pColl = multiSelectCollSeq(pParse, p, pItem->u.x.iOrderByCol-1);
        if( pColl==0 ) pColl = db->pDfltColl;
        pOrderBy->a[i].pExpr =
          sqlite3ExprAddCollateString(pParse, pTerm, pColl->zName);
      }
      assert( sqlite3KeyInfoIsWriteable(pRet) );
      pRet->aColl[i] = pColl;
      pRet->aSortOrder[i] = pOrderBy->a[i].sortOrder;
    }
  }

  return pRet;
}